

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_info.h
# Opt level: O3

bool pybind11::detail::compare_buffer_info<unsigned_long,_void>::compare(buffer_info *b)

{
  int iVar1;
  string *psVar2;
  bool bVar3;
  
  if (b->itemsize == 8) {
    psVar2 = &b->format;
    iVar1 = std::__cxx11::string::compare((char *)psVar2);
    bVar3 = true;
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)psVar2);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)psVar2);
        bVar3 = iVar1 == 0;
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool compare(const buffer_info& b) {
        return (size_t) b.itemsize == sizeof(T) && (b.format == format_descriptor<T>::value ||
            ((sizeof(T) == sizeof(long)) && b.format == (std::is_unsigned<T>::value ? "L" : "l")) ||
            ((sizeof(T) == sizeof(size_t)) && b.format == (std::is_unsigned<T>::value ? "N" : "n")));
    }